

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createSwitchBlockOrderTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  mapped_type *pmVar2;
  allocator<char> local_7d9;
  key_type local_7d8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  string local_788;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  char typesAndConstants [133];
  char function [1679];
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,testCtx,"switch_block_order","Out-of-order blocks for switch");
  local_798._0_4_ = 0;
  local_798._4_4_ = 0;
  uStack_790._0_4_ = 0;
  uStack_790._4_4_ = 0;
  local_7a8._0_4_ = 0;
  local_7a8._4_4_ = 0;
  uStack_7a0._0_4_ = 0;
  uStack_7a0._4_4_ = 0;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memcpy(typesAndConstants,
         "%c_f32_p2  = OpConstant %f32 0.2\n%c_f32_p4  = OpConstant %f32 0.4\n%c_f32_p6  = OpConstant %f32 0.6\n%c_f32_p8  = OpConstant %f32 0.8\n"
         ,0x85);
  memcpy(function,
         "%test_code = OpFunction %v4f32 None %v4f32_function\n%param1    = OpFunctionParameter %v4f32\n%lbl       = OpLabel\n%iptr      = OpVariable %fp_i32 Function\n%result    = OpVariable %fp_v4f32 Function\n             OpStore %iptr %c_i32_0\n             OpStore %result %param1\n             OpBranch %loop\n%loop      = OpLabel\n%ival      = OpLoad %i32 %iptr\n%lt_4      = OpSLessThan %bool %ival %c_i32_4\n             OpLoopMerge %exit %switch_exit None\n             OpBranchConditional %lt_4 %switch_entry %exit\n%exit      = OpLabel\n%ret       = OpLoad %v4f32 %result\n             OpReturnValue %ret\n%switch_entry   = OpLabel\n%loc            = OpAccessChain %fp_f32 %result %ival\n%val            = OpLoad %f32 %loc\n                  OpSelectionMerge %switch_exit None\n                  OpSwitch %ival %switch_default 0 %case0 1 %case1 2 %case2 3 %case3\n%case2          = OpLabel\n%addp4          = OpFAdd %f32 %val %c_f32_p4\n                  OpStore %loc %addp4\n                  OpBranch %switch_exit\n%switch_default = OpLabel\n                  OpUnreachable\n%case3          = OpLabel\n%addp8          = OpFAdd %f32 %val %c_f32_p8\n                  OpStore %loc %addp8\n                  OpBranch %switch_exit\n%case0          = OpLabel\n%addp2          = OpFAdd %f32 %val %c_f32_p2\n                  OpStore %loc %addp2\n                  OpBranch %switch_exit\n%switch_exit    = OpLabel\n%ival_next      = OpIAdd %i32 %ival %c_i32_1\n                  OpStore %iptr %ival_next\n                  OpBranch %loop\n%case1          = OpLabel\n%addp6          = OpFAdd %f32 %val %c_f32_p6\n                  OpStore %loc %addp6\n                  OpBranch %switch_exit\n                  OpFunctionEnd\n"
         ,0x68f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"pre_main",(allocator<char> *)&local_788);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_7d8);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"testfun",(allocator<char> *)&local_788);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,&local_7d8);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_7d8);
  local_798._0_4_ = 0x337f1b7f;
  local_798._4_4_ = 0x3300007f;
  uStack_790._0_4_ = 0x33001b00;
  uStack_790._4_4_ = 0x337f0000;
  local_7a8._0_4_ = 0xffe5b4b2;
  local_7a8._4_4_ = 0xff6699b2;
  uStack_7a0._0_4_ = 0xff66b433;
  uStack_7a0._4_4_ = 0xffe59933;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d8,"out_of_order",&local_7d9)
  ;
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  local_788._M_string_length = 0;
  local_788.field_2._M_local_buf[0] = '\0';
  createTestsForAllStages
            (&local_7d8,(RGBA (*) [4])&local_798,(RGBA (*) [4])&local_7a8,&fragments,
             group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr,QP_TEST_RESULT_FAIL,&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_7d8);
  pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createSwitchBlockOrderTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group				(new tcu::TestCaseGroup(testCtx, "switch_block_order", "Out-of-order blocks for switch"));
	RGBA							inputColors[4];
	RGBA							outputColors[4];
	map<string, string>				fragments;

	const char						typesAndConstants[]	=
		"%c_f32_p2  = OpConstant %f32 0.2\n"
		"%c_f32_p4  = OpConstant %f32 0.4\n"
		"%c_f32_p6  = OpConstant %f32 0.6\n"
		"%c_f32_p8  = OpConstant %f32 0.8\n";

	// vec4 test_code(vec4 param) {
	//   vec4 result = param;
	//   for (int i = 0; i < 4; ++i) {
	//     switch (i) {
	//       case 0: result[i] += .2; break;
	//       case 1: result[i] += .6; break;
	//       case 2: result[i] += .4; break;
	//       case 3: result[i] += .8; break;
	//       default: break; // unreachable
	//     }
	//   }
	//   return result;
	// }
	const char						function[]			=
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1    = OpFunctionParameter %v4f32\n"
		"%lbl       = OpLabel\n"
		"%iptr      = OpVariable %fp_i32 Function\n"
		"%result    = OpVariable %fp_v4f32 Function\n"
		"             OpStore %iptr %c_i32_0\n"
		"             OpStore %result %param1\n"
		"             OpBranch %loop\n"

		// Loop entry block.
		"%loop      = OpLabel\n"
		"%ival      = OpLoad %i32 %iptr\n"
		"%lt_4      = OpSLessThan %bool %ival %c_i32_4\n"
		"             OpLoopMerge %exit %switch_exit None\n"
		"             OpBranchConditional %lt_4 %switch_entry %exit\n"

		// Merge block for loop.
		"%exit      = OpLabel\n"
		"%ret       = OpLoad %v4f32 %result\n"
		"             OpReturnValue %ret\n"

		// Switch-statement entry block.
		"%switch_entry   = OpLabel\n"
		"%loc            = OpAccessChain %fp_f32 %result %ival\n"
		"%val            = OpLoad %f32 %loc\n"
		"                  OpSelectionMerge %switch_exit None\n"
		"                  OpSwitch %ival %switch_default 0 %case0 1 %case1 2 %case2 3 %case3\n"

		"%case2          = OpLabel\n"
		"%addp4          = OpFAdd %f32 %val %c_f32_p4\n"
		"                  OpStore %loc %addp4\n"
		"                  OpBranch %switch_exit\n"

		"%switch_default = OpLabel\n"
		"                  OpUnreachable\n"

		"%case3          = OpLabel\n"
		"%addp8          = OpFAdd %f32 %val %c_f32_p8\n"
		"                  OpStore %loc %addp8\n"
		"                  OpBranch %switch_exit\n"

		"%case0          = OpLabel\n"
		"%addp2          = OpFAdd %f32 %val %c_f32_p2\n"
		"                  OpStore %loc %addp2\n"
		"                  OpBranch %switch_exit\n"

		// Merge block for switch-statement.
		"%switch_exit    = OpLabel\n"
		"%ival_next      = OpIAdd %i32 %ival %c_i32_1\n"
		"                  OpStore %iptr %ival_next\n"
		"                  OpBranch %loop\n"

		"%case1          = OpLabel\n"
		"%addp6          = OpFAdd %f32 %val %c_f32_p6\n"
		"                  OpStore %loc %addp6\n"
		"                  OpBranch %switch_exit\n"

		"                  OpFunctionEnd\n";

	fragments["pre_main"]	= typesAndConstants;
	fragments["testfun"]	= function;

	inputColors[0]			= RGBA(127, 27,  127, 51);
	inputColors[1]			= RGBA(127, 0,   0,   51);
	inputColors[2]			= RGBA(0,   27,  0,   51);
	inputColors[3]			= RGBA(0,   0,   127, 51);

	outputColors[0]			= RGBA(178, 180, 229, 255);
	outputColors[1]			= RGBA(178, 153, 102, 255);
	outputColors[2]			= RGBA(51,  180, 102, 255);
	outputColors[3]			= RGBA(51,  153, 229, 255);

	createTestsForAllStages("out_of_order", inputColors, outputColors, fragments, group.get());

	return group.release();
}